

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t cmp_node(archive_rb_node *n1,archive_rb_node *n2)

{
  zip_entry *e2;
  zip_entry *e1;
  archive_rb_node *n2_local;
  archive_rb_node *n1_local;
  
  if ((long)n2[1].rb_nodes[1] < (long)n1[1].rb_nodes[1]) {
    n1_local._4_4_ = L'\xffffffff';
  }
  else if ((long)n1[1].rb_nodes[1] < (long)n2[1].rb_nodes[1]) {
    n1_local._4_4_ = L'\x01';
  }
  else {
    n1_local._4_4_ = L'\0';
  }
  return n1_local._4_4_;
}

Assistant:

static int
cmp_node(const struct archive_rb_node *n1, const struct archive_rb_node *n2)
{
	const struct zip_entry *e1 = (const struct zip_entry *)n1;
	const struct zip_entry *e2 = (const struct zip_entry *)n2;

	if (e1->local_header_offset > e2->local_header_offset)
		return -1;
	if (e1->local_header_offset < e2->local_header_offset)
		return 1;
	return 0;
}